

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.cpp
# Opt level: O0

void __thiscall libDAI::IJGP::IJGP(IJGP *this,FactorGraph *fg,Properties *opts)

{
  unsigned_long uVar1;
  byte bVar2;
  undefined8 uVar3;
  long *plVar4;
  ulong uVar5;
  TFactor<double> *pTVar6;
  size_type sVar7;
  reference pvVar8;
  ulong uVar9;
  ostream *poVar10;
  reference pvVar11;
  void *this_00;
  size_type sVar12;
  reference pvVar13;
  vector<libDAI::Region,_std::allocator<libDAI::Region>_> *pvVar14;
  FRegion *pFVar15;
  reference pvVar16;
  size_t sVar17;
  RegionGraph *rg;
  RegionGraph *this_01;
  long *in_RDI;
  size_t e;
  size_t beta;
  size_t alpha_1;
  size_t alpha2_1;
  size_t alpha2;
  size_t bE;
  Bucket *mb;
  size_t alpha;
  size_t j;
  size_t _j;
  VarSet vars;
  size_t mb_i_index;
  vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> mb_i;
  size_t i_3;
  Var vi;
  size_t _i;
  size_t nrArcs;
  size_t lowest;
  VarSet Ivars;
  size_t I_1;
  vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> minibuckets;
  size_t i_2;
  vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> buckets;
  size_t i_1;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ElimSeq;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> ElimOrder;
  size_t I;
  ClusterGraph _cg;
  value_type *in_stack_fffffffffffff4f8;
  RegionGraph *in_stack_fffffffffffff500;
  Factor *in_stack_fffffffffffff508;
  RegionGraph *in_stack_fffffffffffff510;
  RegionGraph *in_stack_fffffffffffff518;
  IJGP *in_stack_fffffffffffff520;
  Var *in_stack_fffffffffffff528;
  VarSet *in_stack_fffffffffffff530;
  Bucket *in_stack_fffffffffffff538;
  RegionGraph *in_stack_fffffffffffff540;
  string *in_stack_fffffffffffff570;
  size_t in_stack_fffffffffffff578;
  Exception *in_stack_fffffffffffff580;
  VarSet *in_stack_fffffffffffff590;
  VarSet *in_stack_fffffffffffff598;
  VarSet *in_stack_fffffffffffff5a8;
  ClusterGraph *in_stack_fffffffffffff5b0;
  ClusterGraph *in_stack_fffffffffffff688;
  ostream *in_stack_fffffffffffff768;
  Bucket *in_stack_fffffffffffff770;
  IJGP *in_stack_fffffffffffff778;
  ulong local_670;
  ulong local_630;
  ulong local_628;
  size_type local_5d8;
  pair<unsigned_long,_unsigned_long> local_5d0;
  size_type local_5c0;
  pair<unsigned_long,_unsigned_long> local_5b8;
  unsigned_long local_5a8 [10];
  size_type local_558;
  pair<unsigned_long,_unsigned_long> local_550;
  size_type local_540;
  pair<unsigned_long,_unsigned_long> local_538;
  size_t local_528;
  ulong local_520;
  reference local_480;
  unsigned_long local_478 [11];
  size_type local_420;
  size_t local_418;
  ulong local_3f0;
  vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> local_3e8;
  size_type local_3d0;
  long local_3c8;
  size_t sStack_3c0;
  ulong local_3b8;
  long local_3b0;
  size_t local_358;
  ulong local_330;
  vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> local_328 [2];
  ulong local_2f0;
  vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> local_2e8;
  ulong local_2d0;
  undefined8 local_2c8;
  ulong local_2c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2b8;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> local_2a0;
  ulong local_288;
  undefined1 local_1ea;
  
  RegionGraph::RegionGraph
            ((RegionGraph *)in_stack_fffffffffffff520,(FactorGraph *)in_stack_fffffffffffff518);
  DAIAlg<libDAI::RegionGraph>::DAIAlg
            (&in_stack_fffffffffffff520->super_DAIAlgRG,in_stack_fffffffffffff518,
             (Properties *)in_stack_fffffffffffff510);
  RegionGraph::~RegionGraph(in_stack_fffffffffffff500);
  *in_RDI = (long)&PTR_clone_00d4dad8;
  in_RDI[0x3f] = 0;
  in_RDI[0x40] = 0;
  in_RDI[0x41] = 0;
  in_RDI[0x42] = 0;
  in_RDI[0x3d] = 0;
  in_RDI[0x3e] = 0;
  in_RDI[0x3f] = 0;
  in_RDI[0x40] = 0;
  {unnamed_type#1}::IJGP((anon_struct_48_6_3543120d_for_Props *)0xb54d64);
  in_RDI[0x43] = 0;
  in_RDI[0x44] = 0;
  *(undefined1 (*) [16])(in_RDI + 0x45) = (undefined1  [16])0x0;
  in_RDI[0x47] = 0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb54dbb)
  ;
  in_RDI[0x48] = 0;
  in_RDI[0x49] = 0;
  in_RDI[0x4a] = 0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb54df6)
  ;
  in_RDI[0x4b] = 0;
  in_RDI[0x4c] = 0;
  in_RDI[0x4d] = 0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb54e31)
  ;
  bVar2 = (**(code **)(*in_RDI + 0x88))();
  if ((bVar2 & 1) != 0) {
    ClusterGraph::ClusterGraph((ClusterGraph *)0xb54fb7);
    local_288 = 0;
    while( true ) {
      uVar9 = local_288;
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar5 = (**(code **)(*plVar4 + 0x48))();
      if (uVar5 <= uVar9) break;
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      pTVar6 = (TFactor<double> *)(**(code **)(*plVar4 + 0x50))(plVar4,local_288);
      TFactor<double>::vars(pTVar6);
      ClusterGraph::insert(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      local_288 = local_288 + 1;
    }
    ClusterGraph::eraseNonMaximal((ClusterGraph *)in_stack_fffffffffffff510);
    ClusterGraph::MinFill(in_stack_fffffffffffff688);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xb550ff);
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::size(&local_2a0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff530,
               (size_type)in_stack_fffffffffffff528);
    for (local_2c0 = 0; uVar9 = local_2c0,
        sVar7 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::size(&local_2a0),
        uVar9 < sVar7; local_2c0 = local_2c0 + 1) {
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      pvVar8 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[]
                         (&local_2a0,local_2c0);
      local_2c8 = (**(code **)(*plVar4 + 0x40))(plVar4,pvVar8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff500,
                 (value_type_conflict2 *)in_stack_fffffffffffff4f8);
    }
    uVar9 = (**(code **)(*in_RDI + 0x30))();
    if (2 < uVar9) {
      poVar10 = std::operator<<((ostream *)&std::cout,"MinFill variable elimination order:");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      for (local_2d0 = 0; uVar9 = local_2d0,
          sVar7 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::size(&local_2a0),
          uVar9 < sVar7; local_2d0 = local_2d0 + 1) {
        if (local_2d0 != 0) {
          std::operator<<((ostream *)&std::cout,", ");
        }
        std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[](&local_2a0,local_2d0);
        libDAI::operator<<((ostream *)in_stack_fffffffffffff500,(Var *)in_stack_fffffffffffff4f8);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::vector
              ((vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> *)0xb55324);
    plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
    (**(code **)(*plVar4 + 0x28))();
    std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::reserve
              ((vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> *)
               in_stack_fffffffffffff530,(size_type)in_stack_fffffffffffff528);
    local_2f0 = 0;
    while( true ) {
      uVar9 = local_2f0;
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar5 = (**(code **)(*plVar4 + 0x28))();
      if (uVar5 <= uVar9) break;
      Bucket::Bucket((Bucket *)in_stack_fffffffffffff500,(size_t)in_stack_fffffffffffff4f8);
      std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::push_back
                ((vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> *)
                 in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
      Bucket::~Bucket((Bucket *)0xb55417);
      local_2f0 = local_2f0 + 1;
    }
    std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::vector
              ((vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> *)0xb5547c);
    plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
    (**(code **)(*plVar4 + 0x28))();
    std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::reserve
              ((vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> *)
               in_stack_fffffffffffff530,(size_type)in_stack_fffffffffffff528);
    local_330 = 0;
    while( true ) {
      uVar9 = local_330;
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar5 = (**(code **)(*plVar4 + 0x48))();
      if (uVar5 <= uVar9) break;
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      pTVar6 = (TFactor<double> *)(**(code **)(*plVar4 + 0x50))(plVar4,local_330);
      TFactor<double>::vars(pTVar6);
      VarSet::VarSet((VarSet *)in_stack_fffffffffffff500,(VarSet *)in_stack_fffffffffffff4f8);
      local_358 = findElimOrderIndex(in_stack_fffffffffffff520,
                                     (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
                                     in_stack_fffffffffffff518,(VarSet *)in_stack_fffffffffffff510,
                                     (size_t)in_stack_fffffffffffff508);
      uVar9 = (**(code **)(*in_RDI + 0x30))();
      if (2 < uVar9) {
        poVar10 = libDAI::operator<<((ostream *)in_stack_fffffffffffff520,
                                     (VarSet *)in_stack_fffffffffffff518);
        std::operator<<(poVar10,"->");
        std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[](&local_2a0,local_358);
        poVar10 = libDAI::operator<<((ostream *)in_stack_fffffffffffff500,
                                     (Var *)in_stack_fffffffffffff4f8);
        poVar10 = std::operator<<(poVar10," ");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_2b8,local_358);
      std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::operator[]
                (&local_2e8,*pvVar11);
      VarSet::VarSet((VarSet *)in_stack_fffffffffffff500,(VarSet *)in_stack_fffffffffffff4f8);
      BucketEntry::BucketEntry
                ((BucketEntry *)in_stack_fffffffffffff510,&in_stack_fffffffffffff508->_vs,
                 SUB81((ulong)in_stack_fffffffffffff500 >> 0x38,0),(size_t)in_stack_fffffffffffff4f8
                );
      std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::push_back
                ((vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_> *)
                 in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
      BucketEntry::~BucketEntry((BucketEntry *)0xb55767);
      VarSet::~VarSet((VarSet *)0xb55774);
      VarSet::~VarSet((VarSet *)0xb55781);
      local_330 = local_330 + 1;
    }
    local_3b0 = 0;
    for (local_3b8 = 0; uVar9 = local_3b8,
        sVar7 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::size(&local_2a0),
        uVar9 < sVar7; local_3b8 = local_3b8 + 1) {
      pvVar8 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[]
                         (&local_2a0,local_3b8);
      local_3c8 = pvVar8->_label;
      sStack_3c0 = pvVar8->_states;
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_2b8,local_3b8);
      local_3d0 = *pvVar11;
      std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::operator[]
                (&local_2e8,local_3d0);
      partitionBucket(in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                      (size_t)in_stack_fffffffffffff768);
      uVar9 = (**(code **)(*in_RDI + 0x30))();
      if (2 < uVar9) {
        poVar10 = std::operator<<((ostream *)&std::cout,"number of minibuckets created: ");
        sVar7 = std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::size
                          (&local_3e8);
        this_00 = (void *)std::ostream::operator<<(poVar10,sVar7);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
      sVar7 = std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::size
                        (&local_3e8);
      local_3b0 = (sVar7 - 1) + local_3b0;
      for (local_3f0 = 0; uVar9 = local_3f0,
          sVar7 = std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::size
                            (&local_3e8), uVar9 < sVar7; local_3f0 = local_3f0 + 1) {
        std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::operator[]
                  (&local_3e8,local_3f0);
        std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::push_back
                  ((vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> *)
                   in_stack_fffffffffffff510,(value_type *)in_stack_fffffffffffff508);
        std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::back
                  ((vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> *)
                   in_stack_fffffffffffff500);
        Bucket::vars(in_stack_fffffffffffff538);
        uVar9 = (**(code **)(*in_RDI + 0x30))();
        if (2 < uVar9) {
          std::operator<<((ostream *)&std::cout,"  mb.vars = ");
          poVar10 = libDAI::operator<<((ostream *)in_stack_fffffffffffff520,
                                       (VarSet *)in_stack_fffffffffffff518);
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        }
        VarSet::operator/=(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
        sVar12 = VarSet::size((VarSet *)0xb55aad);
        if (sVar12 != 0) {
          local_418 = findElimOrderIndex(in_stack_fffffffffffff520,
                                         (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
                                         in_stack_fffffffffffff518,
                                         (VarSet *)in_stack_fffffffffffff510,
                                         (size_t)in_stack_fffffffffffff508);
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&local_2b8,local_418);
          local_420 = *pvVar11;
          std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::operator[]
                    (&local_2e8,local_420);
          VarSet::VarSet((VarSet *)in_stack_fffffffffffff500,(VarSet *)in_stack_fffffffffffff4f8);
          std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::size(local_328);
          BucketEntry::BucketEntry
                    ((BucketEntry *)in_stack_fffffffffffff510,&in_stack_fffffffffffff508->_vs,
                     SUB81((ulong)in_stack_fffffffffffff500 >> 0x38,0),
                     (size_t)in_stack_fffffffffffff4f8);
          std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::
          push_back((vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_> *
                    )in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
          BucketEntry::~BucketEntry((BucketEntry *)0xb55baf);
          VarSet::~VarSet((VarSet *)0xb55bbc);
          local_3b0 = local_3b0 + 1;
          uVar9 = (**(code **)(*in_RDI + 0x30))();
          if (2 < uVar9) {
            std::operator<<((ostream *)&std::cout,"  added arc to bucket");
            plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
            (**(code **)(*plVar4 + 0x30))(plVar4,local_420);
            poVar10 = libDAI::operator<<((ostream *)in_stack_fffffffffffff500,
                                         (Var *)in_stack_fffffffffffff4f8);
            in_stack_fffffffffffff778 = (IJGP *)std::operator<<(poVar10,", i.e. (");
            in_stack_fffffffffffff770 =
                 (Bucket *)std::ostream::operator<<(in_stack_fffffffffffff778,local_3b8);
            in_stack_fffffffffffff768 = std::operator<<((ostream *)in_stack_fffffffffffff770,",");
            poVar10 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffff768,local_418);
            poVar10 = std::operator<<(poVar10,")");
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          }
        }
        VarSet::~VarSet((VarSet *)0xb55d7b);
      }
      std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::~vector
                ((vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> *)
                 in_stack_fffffffffffff510);
    }
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::ORs((RegionGraph *)0xb55e03);
    std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::size(local_328);
    std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::reserve
              ((vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_> *)
               in_stack_fffffffffffff540,(size_type)in_stack_fffffffffffff538);
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::IRs((RegionGraph *)0xb55e54);
    std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::reserve
              ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)in_stack_fffffffffffff540,
               (size_type)in_stack_fffffffffffff538);
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::Redges((RegionGraph *)0xb55e9d);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)in_stack_fffffffffffff530,(size_type)in_stack_fffffffffffff528);
    for (local_478[0] = 0; uVar1 = local_478[0],
        sVar7 = std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::size
                          (local_328), uVar1 < sVar7; local_478[0] = local_478[0] + 1) {
      local_480 = std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::
                  operator[](local_328,local_478[0]);
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::ORs((RegionGraph *)0xb55f43);
      Bucket::vars(in_stack_fffffffffffff538);
      TFactor<double>::TFactor
                ((TFactor<double> *)in_stack_fffffffffffff520,(VarSet *)in_stack_fffffffffffff518,
                 (Real)in_stack_fffffffffffff510);
      FRegion::FRegion((FRegion *)in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                       (double)in_stack_fffffffffffff500);
      std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::push_back
                ((vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_> *)
                 in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
      FRegion::~FRegion((FRegion *)0xb55fc6);
      TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff500);
      VarSet::~VarSet((VarSet *)0xb55fe0);
      for (local_520 = 0; uVar9 = local_520,
          sVar7 = std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                  ::size(&local_480->
                          super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                        ), uVar9 < sVar7; local_520 = local_520 + 1) {
        pvVar13 = std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                  ::operator[](&local_480->
                                super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                               ,local_520);
        if ((pvVar13->isFactor & 1U) == 0) {
          pvVar13 = std::
                    vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::
                    operator[](&local_480->
                                super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                               ,local_520);
          local_528 = pvVar13->pointsTo;
          (**(code **)(*in_RDI + 0x28))();
          RegionGraph::Redges((RegionGraph *)0xb56141);
          (**(code **)(*in_RDI + 0x28))();
          pvVar14 = RegionGraph::IRs((RegionGraph *)0xb56173);
          local_540 = std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::size(pvVar14);
          std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long,_true>
                    (&local_538,local_478,&local_540);
          std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
          (**(code **)(*in_RDI + 0x28))();
          RegionGraph::Redges((RegionGraph *)0xb561f0);
          (**(code **)(*in_RDI + 0x28))();
          pvVar14 = RegionGraph::IRs((RegionGraph *)0xb56222);
          local_558 = std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::size(pvVar14);
          std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long,_true>
                    (&local_550,&local_528,&local_558);
          std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
          (**(code **)(*in_RDI + 0x28))();
          RegionGraph::IRs((RegionGraph *)0xb5629f);
          (**(code **)(*in_RDI + 0x28))();
          pFVar15 = RegionGraph::OR(in_stack_fffffffffffff500,(long)in_stack_fffffffffffff4f8);
          TFactor<double>::vars(&pFVar15->super_Factor);
          (**(code **)(*in_RDI + 0x28))();
          pFVar15 = RegionGraph::OR(in_stack_fffffffffffff500,(long)in_stack_fffffffffffff4f8);
          TFactor<double>::vars(&pFVar15->super_Factor);
          VarSet::operator&(in_stack_fffffffffffff598,in_stack_fffffffffffff590);
          Region::Region((Region *)in_stack_fffffffffffff510,&in_stack_fffffffffffff508->_vs,
                         (double)in_stack_fffffffffffff500);
          std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::push_back
                    ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                     in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
          Region::~Region((Region *)0xb563ad);
          VarSet::~VarSet((VarSet *)0xb563ba);
        }
        else {
          (**(code **)(*in_RDI + 0x28))();
          std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::
          operator[](&local_480->
                      super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                     ,local_520);
          RegionGraph::setFac2OR
                    (in_stack_fffffffffffff510,(size_t)in_stack_fffffffffffff508,
                     (size_t)in_stack_fffffffffffff500);
        }
      }
      if ((local_478[0] != 0) &&
         (pvVar16 = std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::
                    operator[](local_328,local_478[0] - 1), pvVar16->var == local_480->var)) {
        local_5a8[0] = local_478[0] - 1;
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::Redges((RegionGraph *)0xb56499);
        (**(code **)(*in_RDI + 0x28))();
        pvVar14 = RegionGraph::IRs((RegionGraph *)0xb564cb);
        local_5c0 = std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::size(pvVar14);
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long,_true>
                  (&local_5b8,local_478,&local_5c0);
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::Redges((RegionGraph *)0xb56548);
        (**(code **)(*in_RDI + 0x28))();
        pvVar14 = RegionGraph::IRs((RegionGraph *)0xb5657a);
        local_5d8 = std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::size(pvVar14);
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long,_true>
                  (&local_5d0,local_5a8,&local_5d8);
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::IRs((RegionGraph *)0xb565f7);
        plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
        (**(code **)(*plVar4 + 0x30))(plVar4,local_480->var);
        VarSet::VarSet((VarSet *)in_stack_fffffffffffff510,(Var *)in_stack_fffffffffffff508);
        Region::Region((Region *)in_stack_fffffffffffff510,&in_stack_fffffffffffff508->_vs,
                       (double)in_stack_fffffffffffff500);
        std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::push_back
                  ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                   in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
        Region::~Region((Region *)0xb5669d);
        VarSet::~VarSet((VarSet *)0xb566aa);
      }
    }
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::Regenerate((RegionGraph *)0xb5673a);
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::RecomputeORs(in_stack_fffffffffffff540);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               0xb56782);
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::nr_ORs((RegionGraph *)0xb567aa);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffff540,(size_type)in_stack_fffffffffffff538);
    local_628 = 0;
    while( true ) {
      (**(code **)(*in_RDI + 0x28))();
      sVar17 = RegionGraph::nr_ORs((RegionGraph *)0xb5680f);
      if (sVar17 <= local_628) break;
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::OR(in_stack_fffffffffffff500,(long)in_stack_fffffffffffff4f8);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 in_stack_fffffffffffff510,in_stack_fffffffffffff508);
      local_628 = local_628 + 1;
    }
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               0xb568c7);
    (**(code **)(*in_RDI + 0x28))();
    poVar10 = (ostream *)RegionGraph::nr_IRs((RegionGraph *)0xb568ef);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffff540,(size_type)in_stack_fffffffffffff538);
    local_630 = 0;
    while( true ) {
      rg = (RegionGraph *)(**(code **)(*in_RDI + 0x28))();
      sVar17 = RegionGraph::nr_IRs((RegionGraph *)0xb56954);
      if (sVar17 <= local_630) break;
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::IR(in_stack_fffffffffffff500,(long)in_stack_fffffffffffff4f8);
      TFactor<double>::TFactor
                ((TFactor<double> *)in_stack_fffffffffffff520,(VarSet *)in_stack_fffffffffffff518,
                 (Real)in_stack_fffffffffffff510);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 in_stack_fffffffffffff500,&in_stack_fffffffffffff4f8->super_Factor);
      TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff500);
      local_630 = local_630 + 1;
    }
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               0xb56a5d);
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::nr_Redges((RegionGraph *)0xb56a85);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffff540,(size_type)in_stack_fffffffffffff538);
    local_670 = 0;
    while( true ) {
      this_01 = (RegionGraph *)(**(code **)(*in_RDI + 0x28))();
      sVar17 = RegionGraph::nr_Redges((RegionGraph *)0xb56ad8);
      if (sVar17 <= local_670) break;
      (**(code **)(*in_RDI + 0x28))();
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::Redge(in_stack_fffffffffffff500,(size_t)in_stack_fffffffffffff4f8);
      RegionGraph::IR(in_stack_fffffffffffff500,(long)in_stack_fffffffffffff4f8);
      TFactor<double>::TFactor
                ((TFactor<double> *)in_stack_fffffffffffff520,(VarSet *)in_stack_fffffffffffff518,
                 (Real)in_stack_fffffffffffff510);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 in_stack_fffffffffffff500,&in_stack_fffffffffffff4f8->super_Factor);
      TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff500);
      local_670 = local_670 + 1;
    }
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::Check_Counting_Numbers(this_01);
    uVar9 = (**(code **)(*in_RDI + 0x30))();
    if (2 < uVar9) {
      in_stack_fffffffffffff510 =
           (RegionGraph *)std::operator<<((ostream *)&std::cout,"Resulting regiongraph: ");
      (**(code **)(*in_RDI + 0x28))();
      poVar10 = libDAI::operator<<(poVar10,rg);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
    std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::~vector
              ((vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> *)
               in_stack_fffffffffffff510);
    std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::~vector
              ((vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> *)
               in_stack_fffffffffffff510);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff510);
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::~vector
              ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)in_stack_fffffffffffff510);
    ClusterGraph::~ClusterGraph((ClusterGraph *)0xb56cc4);
    return;
  }
  local_1ea = 1;
  uVar3 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff540,(char *)in_stack_fffffffffffff538,
             (allocator<char> *)in_stack_fffffffffffff530);
  Exception::Exception
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_stack_fffffffffffff570);
  local_1ea = 0;
  __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

IJGP::IJGP( const FactorGraph &fg, const Properties &opts ) : DAIAlgRG(fg, opts), Props(), _maxdiff(0.0), _iterations(0UL), _Qa(), _Qb(), _mes() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        ClusterGraph _cg;

        // Copy factor varsets
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            _cg.insert( grm().factor(I).vars() );
        // Retain only maximal clusters
        _cg.eraseNonMaximal();
        // Obtain (heuristically) optimal elimination sequence
        vector<Var> ElimOrder = _cg.MinFill();
        vector<size_t> ElimSeq;
        ElimSeq.reserve( ElimOrder.size() );
        for( size_t i = 0; i < ElimOrder.size(); i++ )
            ElimSeq.push_back( grm().findVar(ElimOrder[i]) );
        if( Verbose() >= 3 ) {
            cout << "MinFill variable elimination order:" << endl;
            for( size_t i = 0; i < ElimOrder.size(); i++ ) {
                if( i != 0 )
                    cout << ", ";
                cout << ElimOrder[i];
            }
            cout << endl;
        }

        // Each variable has an associated bucket
        vector<Bucket> buckets;
        buckets.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            buckets.push_back( Bucket(i) );

        // Each minibucket will correspond to an outer region
        vector<Bucket> minibuckets;
        minibuckets.reserve( grm().nrVars() );

        // Place each factor in the bucket of the lowest (first-to-eliminate) index variable in its domain
        for( size_t I = 0; I < grm().nrFactors(); I++ ) {
            VarSet Ivars = grm().factor(I).vars();
            size_t lowest = findElimOrderIndex( ElimOrder, Ivars );
            if( Verbose() >= 3 )
                cout << Ivars << "->" << ElimOrder[lowest] << " " << endl;

            buckets[ElimSeq[lowest]].push_back( BucketEntry( Ivars, true, I ) );
        }

        // For each bucket
        size_t nrArcs = 0;
        for( size_t _i = 0; _i < ElimOrder.size(); _i++ ) {
            Var vi = ElimOrder[_i];
            size_t i = ElimSeq[_i];

            // Partition bucket into mini-buckets
            vector<Bucket> mb_i = partitionBucket( buckets[i], Props.i );
            if( Verbose() >= 3 )
                cout << "number of minibuckets created: " << mb_i.size() << endl;
            nrArcs += mb_i.size() - 1;
            for( size_t mb_i_index = 0; mb_i_index < mb_i.size(); mb_i_index++ ) {
                minibuckets.push_back( mb_i[mb_i_index] );

                // Eliminate this variable
                VarSet vars = minibuckets.back().vars();
                if( Verbose() >= 3 )
                    cout << "  mb.vars = " << vars << endl;
                vars /= vi;
                if( vars.size() ) {
                    // Find lowest index variable in vars
                    size_t _j = findElimOrderIndex( ElimOrder, vars, _i+1 );
                    // j is the index of that variable
                    size_t j = ElimSeq[_j];
                    // Insert message into the corresponding bucket of j
                    buckets[j].push_back( BucketEntry(vars, false, minibuckets.size()-1 ) );
                    nrArcs++;
                    if( Verbose() >= 3 )
                        cout << "  added arc to bucket" << grm().var(j) << ", i.e. (" << _i << "," << _j << ")" << endl;
                }
            }
        }

        // Each minibucket becomes an outer region that contains the factors in that minibucket
        // For each message in the minibucket, we add an inner region (corresponding to an
        // arc of the join graph) and two edges
        // We also connect minibuckets of the same var with an inner region
        grm().ORs().reserve( minibuckets.size() );
        grm().IRs().reserve( nrArcs );
        grm().Redges().reserve( 2 * nrArcs );
        for( size_t alpha = 0; alpha < minibuckets.size(); alpha++ ) {
            Bucket & mb = minibuckets[alpha];
            grm().ORs().push_back( FRegion( Factor(mb.vars(), 1.0), 1.0 ) );
            for( size_t bE = 0; bE < mb.size(); bE++ )
                if( mb[bE].isFactor )
                    grm().setFac2OR( mb[bE].pointsTo, alpha );
                else {
                    size_t alpha2 = mb[bE].pointsTo;
                    grm().Redges().push_back( RegionGraph::R_edge_t( alpha, grm().IRs().size() ) );
                    grm().Redges().push_back( RegionGraph::R_edge_t( alpha2, grm().IRs().size() ) );
                    grm().IRs().push_back( Region( grm().OR(alpha).vars() & grm().OR(alpha2).vars(), -1.0 ) );
                }
            if( alpha )
                if( minibuckets[alpha-1].var == mb.var ) {
                    size_t alpha2 = alpha - 1;
                    grm().Redges().push_back( RegionGraph::R_edge_t( alpha, grm().IRs().size() ) );
                    grm().Redges().push_back( RegionGraph::R_edge_t( alpha2, grm().IRs().size() ) );
                    grm().IRs().push_back( Region( grm().var(mb.var), -1.0 ) );
                }
        }
        grm().Regenerate();
        grm().RecomputeORs();

        // Create messages and beliefs
        _Qa.clear();
        _Qa.reserve( grm().nr_ORs() );
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa.push_back( grm().OR(alpha) );

        _Qb.clear();
        _Qb.reserve( grm().nr_IRs() );
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) 
            _Qb.push_back( Factor( grm().IR(beta), 1.0 ) );

        _mes.clear();
        _mes.reserve( grm().nr_Redges() );
        for( size_t e = 0; e < grm().nr_Redges(); e++ )
            _mes.push_back( Factor( grm().IR(grm().Redge(e).second), 1.0 ) );

        // Check counting numbers
        grm().Check_Counting_Numbers();

        if( Verbose() >= 3 )
            cout << "Resulting regiongraph: " << grm() << endl;
    }